

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O1

QDBusPlatformMenuItem * __thiscall
QDBusMenuBar::menuItemForMenu(QDBusMenuBar *this,QPlatformMenu *menu)

{
  Span *pSVar1;
  QDBusPlatformMenuItem *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  const_iterator cVar4;
  QDBusPlatformMenuItem *item;
  quintptr tag;
  unsigned_long_long copy;
  QDBusPlatformMenuItem *local_40;
  unsigned_long_long local_38;
  unsigned_long_long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (menu == (QPlatformMenu *)0x0) {
    pQVar2 = (QDBusPlatformMenuItem *)0x0;
  }
  else {
    local_38 = (**(code **)(*(long *)menu + 0x88))(menu);
    cVar4 = QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::constFindImpl<unsigned_long_long>
                      ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)(this + 0x20),&local_38
                      );
    if (cVar4.i.d == (Data<QHashPrivate::Node<unsigned_long_long,_QDBusPlatformMenuItem_*>_> *)0x0
        && cVar4.i.bucket == 0) {
      pQVar2 = (QDBusPlatformMenuItem *)operator_new(0x50);
      QDBusPlatformMenuItem::QDBusPlatformMenuItem((QDBusPlatformMenuItem *)pQVar2);
      local_40 = pQVar2;
      updateMenuItem(pQVar2,menu);
      local_30 = local_38;
      QHash<unsigned_long_long,QDBusPlatformMenuItem*>::emplace<QDBusPlatformMenuItem*const&>
                ((QHash<unsigned_long_long,QDBusPlatformMenuItem*> *)(this + 0x20),&local_30,
                 &local_40);
      pQVar2 = local_40;
    }
    else {
      pSVar1 = (cVar4.i.d)->spans;
      uVar3 = cVar4.i.bucket >> 7;
      pQVar2 = *(QDBusPlatformMenuItem **)
                (pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)cVar4.i.bucket & 0x7f]].storage.
                 data + 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDBusPlatformMenuItem *QDBusMenuBar::menuItemForMenu(QPlatformMenu *menu)
{
    if (!menu)
        return nullptr;
    quintptr tag = menu->tag();
    const auto it = m_menuItems.constFind(tag);
    if (it != m_menuItems.cend()) {
        return *it;
    } else {
        QDBusPlatformMenuItem *item = new QDBusPlatformMenuItem;
        updateMenuItem(item, menu);
        m_menuItems.insert(tag, item);
        return item;
    }
}